

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.cxx
# Opt level: O3

void cb(Fl_Widget *param_1,void *v)

{
  Fl_Type *pFVar1;
  int iVar2;
  int iVar3;
  Fl_Type *o;
  undefined4 extraout_var;
  _func_int **pp_Var4;
  ulong uVar5;
  ulong uVar6;
  int h;
  int w;
  Fl_Color c;
  int s;
  Fl_Font f;
  uint local_2c;
  uint local_28;
  undefined1 local_24 [4];
  int local_20;
  undefined1 local_1c [4];
  
  undo_checkpoint();
  undo_suspend();
  o = (Fl_Type *)(**(code **)(*v + 0x18))(v);
  if (o == (Fl_Type *)0x0) {
    undo_current = undo_current + -1;
    undo_last = undo_last + -1;
  }
  else {
    iVar2 = (*o->_vptr_Fl_Type[0x17])(o);
    if (iVar2 != 0) {
      iVar3 = (*o->_vptr_Fl_Type[0x21])(o);
      iVar2 = Fl_Widget_Type::default_size;
      if (iVar3 == 0) {
        *(int *)&(o[1].prev)->field_0x4c = Fl_Widget_Type::default_size;
        local_20 = iVar2;
        (*o->_vptr_Fl_Type[0x2b])(o,2,local_1c,&local_20,local_24);
        local_28 = 0;
        local_2c = 0;
        (*o->_vptr_Fl_Type[0x2d])(o,&local_28,&local_2c);
        iVar2 = (*o->_vptr_Fl_Type[5])(o);
        iVar2 = strcmp((char *)CONCAT44(extraout_var,iVar2),"Fl_Menu_Bar");
        pFVar1 = o[1].prev;
        if (iVar2 == 0) {
          pp_Var4 = pFVar1->_vptr_Fl_Type;
          uVar6 = 0;
          uVar5 = 0;
        }
        else {
          uVar6 = (ulong)*(uint *)&pFVar1->user_data_;
          uVar5 = (ulong)*(uint *)((long)&pFVar1->user_data_ + 4);
          pp_Var4 = pFVar1->_vptr_Fl_Type;
        }
        (*pp_Var4[4])(pFVar1,uVar6,uVar5,(ulong)local_28,(ulong)local_2c);
      }
    }
    select_only(o);
    set_modflag(1);
    (*o->_vptr_Fl_Type[0xb])(o);
  }
  undo_resume();
  return;
}

Assistant:

static void cb(Fl_Widget *, void *v) {
  undo_checkpoint();
  undo_suspend();
  Fl_Type *t = ((Fl_Type*)v)->make();
  if (t) {
    if (t->is_widget() && !t->is_window()) {
      Fl_Widget_Type *wt = (Fl_Widget_Type *)t;

      // Set font sizes...
      wt->o->labelsize(Fl_Widget_Type::default_size);

      Fl_Font f;
      int s = Fl_Widget_Type::default_size;
      Fl_Color c;

      wt->textstuff(2, f, s, c);

      // Resize and/or reposition new widget...
      int w = 0, h = 0;
      wt->ideal_size(w, h);

      if (!strcmp(wt->type_name(), "Fl_Menu_Bar")) {
        // Move and resize the menubar across the top of the window...
        wt->o->resize(0, 0, w, h);
      } else {
        // Just resize to the ideal size...
        wt->o->size(w, h);
      }
    }
    select_only(t);
    set_modflag(1);
    t->open();
  } else {
    undo_current --;
    undo_last --;
  }
  undo_resume();
}